

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O1

int __thiscall jrtplib::RTCPCompoundPacketBuilder::EndBuild(RTCPCompoundPacketBuilder *this)

{
  size_t *psVar1;
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  *plVar2;
  list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  *plVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  RTPMemoryManager *pRVar7;
  byte bVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  byte *pbVar12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  RTCPSDESPacket *this_00;
  RTCPAPPPacket *this_01;
  RTCPBYEPacket *this_02;
  ushort uVar15;
  _Self __tmp;
  _List_node_base *p_Var16;
  ulong uVar17;
  _Self __tmp_1;
  ulong uVar18;
  byte *data;
  size_t __n;
  byte bVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  
  iVar9 = -0x2a;
  if (this->arebuilding == true) {
    if ((this->report).headerlength == 0) {
      iVar9 = -0x29;
    }
    else {
      sVar5 = this->byesize;
      sVar6 = this->appsize;
      sVar10 = Report::NeededBytes(&this->report);
      sVar11 = SDES::NeededBytes(&this->sdes);
      uVar18 = sVar11 + sVar10 + sVar5 + sVar6;
      if (this->external == false) {
        pRVar7 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
        if (pRVar7 == (RTPMemoryManager *)0x0) {
          pbVar12 = (byte *)operator_new__(uVar18);
        }
        else {
          pbVar12 = (byte *)(**(code **)(*(long *)pRVar7 + 0x10))(pRVar7,uVar18,6);
        }
        if (pbVar12 == (byte *)0x0) {
          return -1;
        }
      }
      else {
        pbVar12 = this->buffer;
      }
      plVar2 = &(this->report).reportblocks;
      p_Var16 = (this->report).reportblocks.
                super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      bVar21 = true;
      bVar22 = false;
      data = pbVar12;
      do {
        *data = *data & 0x1f | 0x80;
        if ((bVar21) && ((this->report).isSR == true)) {
          data[1] = 200;
          memcpy(data + 4,(this->report).headerdata,(this->report).headerlength);
          uVar17 = (this->report).headerlength + 4;
        }
        else {
          data[1] = 0xc9;
          *(undefined4 *)(data + 4) = *(undefined4 *)(this->report).headerdata;
          uVar17 = 8;
        }
        if (p_Var16 == (_List_node_base *)plVar2) {
          bVar8 = 0;
        }
        else {
          bVar19 = 0;
          do {
            memcpy(data + uVar17,p_Var16[1]._M_next,(size_t)p_Var16[1]._M_prev);
            uVar17 = (long)&(p_Var16[1]._M_prev)->_M_next + uVar17;
            bVar8 = bVar19 + 1;
            p_Var16 = p_Var16->_M_next;
            if (p_Var16 == (_List_node_base *)plVar2) break;
            bVar21 = bVar19 < 0x1e;
            bVar19 = bVar8;
          } while (bVar21);
        }
        uVar15 = (ushort)(((uint)(uVar17 >> 2) & 0x3fffffff) - 1);
        *(ushort *)(data + 2) = uVar15 << 8 | uVar15 >> 8;
        *data = *data & 0xe0 | bVar8;
        if (data[1] == 200) {
          pRVar7 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
          if (pRVar7 == (RTPMemoryManager *)0x0) {
            p_Var13 = (_List_node_base *)operator_new(0x20);
          }
          else {
            p_Var13 = (_List_node_base *)(**(code **)(*(long *)pRVar7 + 0x10))(pRVar7,0x20,0x15);
          }
          RTCPSRPacket::RTCPSRPacket((RTCPSRPacket *)p_Var13,data,uVar17);
        }
        else {
          pRVar7 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
          if (pRVar7 == (RTPMemoryManager *)0x0) {
            p_Var13 = (_List_node_base *)operator_new(0x20);
          }
          else {
            p_Var13 = (_List_node_base *)(**(code **)(*(long *)pRVar7 + 0x10))(pRVar7,0x20,0x13);
          }
          RTCPRRPacket::RTCPRRPacket((RTCPRRPacket *)p_Var13,data,uVar17);
        }
        p_Var14 = (_List_node_base *)operator_new(0x18);
        p_Var14[1]._M_next = p_Var13;
        std::__detail::_List_node_base::_M_hook(p_Var14);
        psVar1 = &(this->super_RTCPCompoundPacket).rtcppacklist.
                  super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        data = data + uVar17;
        if (p_Var16 == (_List_node_base *)plVar2) {
          bVar22 = true;
        }
        bVar21 = false;
      } while (!bVar22);
      plVar3 = &(this->sdes).sdessources;
      p_Var16 = (this->sdes).sdessources.
                super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var16 != (_List_node_base *)plVar3) {
        bVar21 = false;
        do {
          *data = *data & 0x1f | 0x80;
          data[1] = 0xca;
          if (p_Var16 == (_List_node_base *)plVar3) {
            bVar8 = 0;
            uVar17 = 4;
          }
          else {
            uVar17 = 4;
            bVar19 = 0;
            do {
              p_Var13 = p_Var16[1]._M_next;
              uVar4 = *(uint *)&p_Var13[1]._M_next;
              *(uint *)(data + uVar17) =
                   uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
              lVar20 = uVar17 + 4;
              for (p_Var14 = *(_List_node_base **)((long)(p_Var13 + 1) + 8);
                  p_Var14 != (_List_node_base *)((long)(p_Var13 + 1) + 8U);
                  p_Var14 = p_Var14->_M_next) {
                memcpy(data + lVar20,p_Var14[1]._M_next,
                       (size_t)*(_List_node_base **)((long)(p_Var14 + 1) + 8));
                lVar20 = (long)&(*(_List_node_base **)((long)(p_Var14 + 1) + 8))->_M_next + lVar20;
              }
              data[lVar20] = 0;
              uVar17 = lVar20 + 1;
              if ((uVar17 & 3) != 0) {
                __n = 4 - (uVar17 & 3);
                memset(data + lVar20 + 1,0,__n);
                uVar17 = uVar17 + __n;
              }
              p_Var16 = p_Var16->_M_next;
              bVar8 = bVar19 + 1;
            } while ((p_Var16 != (_List_node_base *)plVar3) &&
                    (bVar22 = bVar19 < 0x1e, bVar19 = bVar8, bVar22));
            bVar8 = bVar8 & 0x1f;
          }
          uVar15 = (ushort)(((uint)(uVar17 >> 2) & 0x3fffffff) - 1);
          *data = *data & 0xe0 | bVar8;
          *(ushort *)(data + 2) = uVar15 << 8 | uVar15 >> 8;
          pRVar7 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
          if (pRVar7 == (RTPMemoryManager *)0x0) {
            this_00 = (RTCPSDESPacket *)operator_new(0x38);
          }
          else {
            this_00 = (RTCPSDESPacket *)(**(code **)(*(long *)pRVar7 + 0x10))(pRVar7,0x38,0x14);
          }
          RTCPSDESPacket::RTCPSDESPacket(this_00,data,uVar17);
          p_Var13 = (_List_node_base *)operator_new(0x18);
          p_Var13[1]._M_next = (_List_node_base *)this_00;
          std::__detail::_List_node_base::_M_hook(p_Var13);
          psVar1 = &(this->super_RTCPCompoundPacket).rtcppacklist.
                    super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>.
                    _M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          data = data + uVar17;
          if (p_Var16 == (_List_node_base *)plVar3) {
            bVar21 = true;
          }
        } while (!bVar21);
      }
      for (p_Var16 = (this->apppackets).
                     super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
          p_Var16 != (_List_node_base *)&this->apppackets; p_Var16 = p_Var16->_M_next) {
        memcpy(data,p_Var16[1]._M_next,(size_t)p_Var16[1]._M_prev);
        pRVar7 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
        if (pRVar7 == (RTPMemoryManager *)0x0) {
          this_01 = (RTCPAPPPacket *)operator_new(0x28);
        }
        else {
          this_01 = (RTCPAPPPacket *)(**(code **)(*(long *)pRVar7 + 0x10))(pRVar7,0x28,0xf);
        }
        RTCPAPPPacket::RTCPAPPPacket(this_01,data,(size_t)p_Var16[1]._M_prev);
        p_Var13 = (_List_node_base *)operator_new(0x18);
        p_Var13[1]._M_next = (_List_node_base *)this_01;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        psVar1 = &(this->super_RTCPCompoundPacket).rtcppacklist.
                  super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        data = data + (long)p_Var16[1]._M_prev;
      }
      for (p_Var16 = (this->byepackets).
                     super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
          p_Var16 != (_List_node_base *)&this->byepackets; p_Var16 = p_Var16->_M_next) {
        memcpy(data,p_Var16[1]._M_next,(size_t)p_Var16[1]._M_prev);
        pRVar7 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
        if (pRVar7 == (RTPMemoryManager *)0x0) {
          this_02 = (RTCPBYEPacket *)operator_new(0x28);
        }
        else {
          this_02 = (RTCPBYEPacket *)(**(code **)(*(long *)pRVar7 + 0x10))(pRVar7,0x28,0x10);
        }
        RTCPBYEPacket::RTCPBYEPacket(this_02,data,(size_t)p_Var16[1]._M_prev);
        p_Var13 = (_List_node_base *)operator_new(0x18);
        p_Var13[1]._M_next = (_List_node_base *)this_02;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        psVar1 = &(this->super_RTCPCompoundPacket).rtcppacklist.
                  super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        data = data + (long)p_Var16[1]._M_prev;
      }
      (this->super_RTCPCompoundPacket).compoundpacket = pbVar12;
      (this->super_RTCPCompoundPacket).compoundpacketlength = uVar18;
      this->arebuilding = false;
      ClearBuildBuffers(this);
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int RTCPCompoundPacketBuilder::EndBuild()
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (report.headerlength == 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOREPORTPRESENT;
	
	uint8_t *buf;
	size_t len;
	
#ifndef RTP_SUPPORT_RTCPUNKNOWN
	len = appsize+byesize+report.NeededBytes()+sdes.NeededBytes();
#else
	len = appsize+unknownsize+byesize+report.NeededBytes()+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	
	if (!external)
	{
		buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPCOMPOUNDPACKET) uint8_t[len];
		if (buf == 0)
			return ERR_RTP_OUTOFMEM;
	}
	else
		buf = buffer;
	
	uint8_t *curbuf = buf;
	RTCPPacket *p;

	// first, we'll add all report info
	
	{
		bool firstpacket = true;
		bool done = false;
		std::list<Buffer>::const_iterator it = report.reportblocks.begin();
		do
		{
			RTCPCommonHeader *hdr = (RTCPCommonHeader *)curbuf;
			size_t offset;
			
			hdr->version = 2;
			hdr->padding = 0;

			if (firstpacket && report.isSR)
			{
				hdr->packettype = RTP_RTCPTYPE_SR;
				memcpy((curbuf+sizeof(RTCPCommonHeader)),report.headerdata,report.headerlength);
				offset = sizeof(RTCPCommonHeader)+report.headerlength;
			}
			else
			{
				hdr->packettype = RTP_RTCPTYPE_RR;
				memcpy((curbuf+sizeof(RTCPCommonHeader)),report.headerdata,sizeof(uint32_t));
				offset = sizeof(RTCPCommonHeader)+sizeof(uint32_t);
			}
			firstpacket = false;
			
			uint8_t count = 0;

			while (it != report.reportblocks.end() && count < 31)
			{
				memcpy(curbuf+offset,(*it).packetdata,(*it).packetlength);
				offset += (*it).packetlength;
				count++;
				it++;
			}

			size_t numwords = offset/sizeof(uint32_t);

			hdr->length = htons((uint16_t)(numwords-1));
			hdr->count = count;

			// add entry in parent's list
			if (hdr->packettype == RTP_RTCPTYPE_SR)
				p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPSRPACKET) RTCPSRPacket(curbuf,offset);
			else
				p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPRRPACKET) RTCPRRPacket(curbuf,offset);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);

			curbuf += offset;
			if (it == report.reportblocks.end())
				done = true;
		} while (!done);
	}
		
	// then, we'll add the sdes info

	if (!sdes.sdessources.empty())
	{
		bool done = false;
		std::list<SDESSource *>::const_iterator sourceit = sdes.sdessources.begin();
		
		do
		{
			RTCPCommonHeader *hdr = (RTCPCommonHeader *)curbuf;
			size_t offset = sizeof(RTCPCommonHeader);
			
			hdr->version = 2;
			hdr->padding = 0;
			hdr->packettype = RTP_RTCPTYPE_SDES;

			uint8_t sourcecount = 0;
			
			while (sourceit != sdes.sdessources.end() && sourcecount < 31)
			{
				uint32_t *ssrc = (uint32_t *)(curbuf+offset);
				*ssrc = htonl((*sourceit)->ssrc);
				offset += sizeof(uint32_t);
				
				std::list<Buffer>::const_iterator itemit,itemend;

				itemit = (*sourceit)->items.begin();
				itemend = (*sourceit)->items.end();
				while (itemit != itemend)
				{
					memcpy(curbuf+offset,(*itemit).packetdata,(*itemit).packetlength);
					offset += (*itemit).packetlength;
					itemit++;
				}

				curbuf[offset] = 0; // end of item list;
				offset++;

				size_t r = offset&0x03;
				if (r != 0) // align to 32 bit boundary
				{
					size_t num = 4-r;
					size_t i;

					for (i = 0 ; i < num ; i++)
						curbuf[offset+i] = 0;
					offset += num;
				}
				
				sourceit++;
				sourcecount++;
			}

			size_t numwords = offset/4;
			
			hdr->count = sourcecount;
			hdr->length = htons((uint16_t)(numwords-1));

			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPSDESPACKET) RTCPSDESPacket(curbuf,offset);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
			
			curbuf += offset;
			if (sourceit == sdes.sdessources.end())
				done = true;
		} while (!done);
	}
	
	// adding the app data
	
	{
		std::list<Buffer>::const_iterator it;

		for (it = apppackets.begin() ; it != apppackets.end() ; it++)
		{
			memcpy(curbuf,(*it).packetdata,(*it).packetlength);
			
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPAPPPACKET) RTCPAPPPacket(curbuf,(*it).packetlength);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
	
			curbuf += (*it).packetlength;
		}
	}

#ifdef RTP_SUPPORT_RTCPUNKNOWN

	// adding the unknown data
	
	{
		std::list<Buffer>::const_iterator it;

		for (it = unknownpackets.begin() ; it != unknownpackets.end() ; it++)
		{
			memcpy(curbuf,(*it).packetdata,(*it).packetlength);
			
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPUNKNOWNPACKET) RTCPUnknownPacket(curbuf,(*it).packetlength);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
	
			curbuf += (*it).packetlength;
		}
	}

#endif // RTP_SUPPORT_RTCPUNKNOWN 

	// adding bye packets
	
	{
		std::list<Buffer>::const_iterator it;

		for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		{
			memcpy(curbuf,(*it).packetdata,(*it).packetlength);
			
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPBYEPACKET) RTCPBYEPacket(curbuf,(*it).packetlength);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
	
			curbuf += (*it).packetlength;
		}
	}
	
	compoundpacket = buf;
	compoundpacketlength = len;
	arebuilding = false;
	ClearBuildBuffers();
	return 0;
}